

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

char * OGNGetAcTypeName(FlarmAircraftTy _acTy)

{
  if (_acTy - FAT_GLIDER < 0xf) {
    return &DAT_0023e1c4 + *(int *)(&DAT_0023e1c4 + (ulong)(_acTy - FAT_GLIDER) * 4);
  }
  return "unknown";
}

Assistant:

const char* OGNGetAcTypeName (FlarmAircraftTy _acTy)
{
    switch (_acTy) {
        case FAT_UNKNOWN:       return "unknown";
        case FAT_GLIDER:        return "Glider / Motor-Glider";
        case FAT_TOW_PLANE:     return "Tow / Tug Plane";
        case FAT_HELI_ROTOR:    return "Helicopter, Rotorcraft";
        case FAT_PARACHUTE:     return "Parachute";
        case FAT_DROP_PLANE:    return "Drop Plane for parachutes";
        case FAT_HANG_GLIDER:   return "Hangglider";
        case FAT_PARA_GLIDER:   return "Paraglider";
        case FAT_POWERED_AC:    return "Powered Aircraft";
        case FAT_JET_AC:        return "Jet Aircraft";
        case FAT_UFO:           return "Flying Saucer, UFO";
        case FAT_BALLOON:       return "Balloon";
        case FAT_AIRSHIP:       return "Airship";
        case FAT_UAV:           return "Unmanned Aerial Vehicle";
        case FAT_STATIC_OBJ:    return "Static object";
    }
    return "unknown";
}